

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  bool bVar1;
  int iVar2;
  Mat *in_RSI;
  long in_RDI;
  bool numpy_style_slice;
  uint7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  byte bVar3;
  Mat *in_stack_fffffffffffffe18;
  Mat *in_stack_fffffffffffffe28;
  Mat *def;
  undefined8 in_stack_fffffffffffffe30;
  int id;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffe38;
  int def_00;
  Mat local_1a0 [2];
  Mat local_120 [2];
  Mat local_90 [2];
  Mat *local_10;
  
  id = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  def_00 = 0;
  local_10 = in_RSI;
  iVar2 = ParamDict::get((ParamDict *)in_RSI,0,0);
  *(int *)(in_RDI + 0xb8) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,1,def_00);
  *(int *)(in_RDI + 0xbc) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,2,def_00);
  *(int *)(in_RDI + 0xc0) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,3,def_00);
  *(int *)(in_RDI + 0xc4) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,4,def_00);
  *(int *)(in_RDI + 200) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,5,def_00);
  *(int *)(in_RDI + 0xcc) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,6,def_00);
  *(int *)(in_RDI + 0xd0) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,7,def_00);
  *(int *)(in_RDI + 0xd4) = iVar2;
  iVar2 = ParamDict::get((ParamDict *)local_10,8,def_00);
  *(int *)(in_RDI + 0xd8) = iVar2;
  Mat::Mat(local_90);
  ParamDict::get((ParamDict *)CONCAT44(def_00,in_stack_fffffffffffffe38),id,
                 in_stack_fffffffffffffe28);
  Mat::operator=(in_stack_fffffffffffffe18,
                 (Mat *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  Mat::~Mat((Mat *)0x148823);
  Mat::~Mat((Mat *)0x148830);
  this_00 = local_120;
  def = local_10;
  Mat::Mat(this_00);
  iVar2 = (int)((ulong)this_00 >> 0x20);
  ParamDict::get((ParamDict *)CONCAT44(def_00,in_stack_fffffffffffffe38),iVar2,def);
  Mat::operator=(in_stack_fffffffffffffe18,
                 (Mat *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  Mat::~Mat((Mat *)0x148895);
  Mat::~Mat((Mat *)0x1488a2);
  Mat::Mat(local_1a0);
  ParamDict::get((ParamDict *)CONCAT44(def_00,in_stack_fffffffffffffe38),iVar2,def);
  Mat::operator=(local_10,(Mat *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  Mat::~Mat((Mat *)0x148904);
  Mat::~Mat((Mat *)0x14890e);
  bVar1 = Mat::empty((Mat *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  bVar3 = 0;
  if (!bVar1) {
    bVar1 = Mat::empty((Mat *)(ulong)in_stack_fffffffffffffe10);
    bVar3 = bVar1 ^ 0xff;
  }
  if ((((*(int *)(in_RDI + 0xc4) == 0) && (*(int *)(in_RDI + 200) == 0)) &&
      (*(int *)(in_RDI + 0xcc) == 0)) && ((bVar3 & 1) == 0)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (outw == 0 && outh == 0 && outc == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    return 0;
}